

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::update_state_list(torrent *this)

{
  bool bVar1;
  bool local_13;
  bool local_12;
  bool local_11;
  bool is_seeding;
  bool is_downloading;
  bool is_checking;
  torrent *this_local;
  
  local_11 = false;
  local_12 = false;
  local_13 = false;
  bVar1 = is_auto_managed(this);
  if ((bVar1) && (bVar1 = has_error(this), !bVar1)) {
    if (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7) ==
        1) {
      local_11 = true;
    }
    else if ((((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39)
                & 7) == 2) ||
              (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39)
               & 7) == 3)) ||
             (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
              7) == 4)) ||
            (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
             7) == 5)) {
      local_13 = is_finished(this);
      local_12 = !local_13;
    }
  }
  update_list(this,(torrent_list_index_t)0x5,local_12);
  update_list(this,(torrent_list_index_t)0x6,local_13);
  update_list(this,(torrent_list_index_t)0x7,local_11);
  return;
}

Assistant:

void torrent::update_state_list()
	{
		bool is_checking = false;
		bool is_downloading = false;
		bool is_seeding = false;

		if (is_auto_managed() && !has_error())
		{
			if (m_state == torrent_status::checking_files)
			{
				is_checking = true;
			}
			else if (m_state == torrent_status::downloading_metadata
				|| m_state == torrent_status::downloading
				|| m_state == torrent_status::finished
				|| m_state == torrent_status::seeding)
			{
				// torrents that are started (not paused) and
				// inactive are not part of any list. They will not be touched because
				// they are inactive
				if (is_finished())
					is_seeding = true;
				else
					is_downloading = true;
			}
		}

		update_list(aux::session_interface::torrent_downloading_auto_managed
			, is_downloading);
		update_list(aux::session_interface::torrent_seeding_auto_managed
			, is_seeding);
		update_list(aux::session_interface::torrent_checking_auto_managed
			, is_checking);
	}